

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::ItemHoverable(ImRect *bb,ImGuiID id)

{
  ImGuiID in_ESI;
  ImVec2 *unaff_retaddr;
  ImVec2 *in_stack_00000008;
  ImGuiItemFlags item_flags;
  ImGuiWindow *window;
  ImGuiContext *g;
  float in_stack_00000050;
  ImDrawFlags in_stack_00000054;
  float in_stack_00000058;
  ImU32 in_stack_0000005c;
  ImVec2 *in_stack_00000060;
  ImVec2 *in_stack_00000068;
  ImDrawList *in_stack_00000070;
  uint local_30;
  ImGuiContext *pIVar1;
  undefined4 in_stack_ffffffffffffffe8;
  bool in_stack_ffffffffffffffff;
  bool bVar2;
  
  if (((GImGui->HoveredId == 0) || (GImGui->HoveredId == in_ESI)) ||
     ((GImGui->HoveredIdAllowOverlap & 1U) != 0)) {
    if (GImGui->HoveredWindow == GImGui->CurrentWindow) {
      if (((GImGui->ActiveId == 0) || (GImGui->ActiveId == in_ESI)) ||
         ((GImGui->ActiveIdAllowOverlap & 1U) != 0)) {
        pIVar1 = GImGui;
        bVar2 = IsMouseHoveringRect(in_stack_00000008,unaff_retaddr,in_stack_ffffffffffffffff);
        if (bVar2) {
          if ((pIVar1->LastItemData).ID == in_ESI) {
            local_30 = (pIVar1->LastItemData).InFlags;
          }
          else {
            local_30 = pIVar1->CurrentItemFlags;
          }
          if (((local_30 & 0x100) != 0) ||
             (bVar2 = IsWindowContentHoverable
                                ((ImGuiWindow *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                 (ImGuiHoveredFlags)((ulong)pIVar1 >> 0x20)), bVar2)) {
            if (in_ESI != 0) {
              SetHoveredID(in_ESI);
            }
            if ((local_30 & 4) == 0) {
              if (((in_ESI != 0) && ((pIVar1->DebugItemPickerActive & 1U) != 0)) &&
                 (pIVar1->HoveredIdPreviousFrame == in_ESI)) {
                GetForegroundDrawList();
                ImDrawList::AddRect(in_stack_00000070,in_stack_00000068,in_stack_00000060,
                                    in_stack_0000005c,in_stack_00000058,in_stack_00000054,
                                    in_stack_00000050);
              }
              if ((pIVar1->NavDisableMouseHover & 1U) == 0) {
                bVar2 = true;
              }
              else {
                bVar2 = false;
              }
            }
            else {
              if (pIVar1->ActiveId == in_ESI) {
                ClearActiveID();
              }
              pIVar1->HoveredIdDisabled = true;
              bVar2 = false;
            }
          }
          else {
            pIVar1->HoveredIdDisabled = true;
            bVar2 = false;
          }
        }
        else {
          bVar2 = false;
        }
      }
      else {
        bVar2 = false;
      }
    }
    else {
      bVar2 = false;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ImGui::ItemHoverable(const ImRect& bb, ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    if (g.HoveredId != 0 && g.HoveredId != id && !g.HoveredIdAllowOverlap)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (g.HoveredWindow != window)
        return false;
    if (g.ActiveId != 0 && g.ActiveId != id && !g.ActiveIdAllowOverlap)
        return false;
    if (!IsMouseHoveringRect(bb.Min, bb.Max))
        return false;

    // Done with rectangle culling so we can perform heavier checks now.
    ImGuiItemFlags item_flags = (g.LastItemData.ID == id ? g.LastItemData.InFlags : g.CurrentItemFlags);
    if (!(item_flags & ImGuiItemFlags_NoWindowHoverableCheck) && !IsWindowContentHoverable(window, ImGuiHoveredFlags_None))
    {
        g.HoveredIdDisabled = true;
        return false;
    }

    // We exceptionally allow this function to be called with id==0 to allow using it for easy high-level
    // hover test in widgets code. We could also decide to split this function is two.
    if (id != 0)
        SetHoveredID(id);

    // When disabled we'll return false but still set HoveredId
    if (item_flags & ImGuiItemFlags_Disabled)
    {
        // Release active id if turning disabled
        if (g.ActiveId == id)
            ClearActiveID();
        g.HoveredIdDisabled = true;
        return false;
    }

    if (id != 0)
    {
        // [DEBUG] Item Picker tool!
        // We perform the check here because SetHoveredID() is not frequently called (1~ time a frame), making
        // the cost of this tool near-zero. We can get slightly better call-stack and support picking non-hovered
        // items if we performed the test in ItemAdd(), but that would incur a small runtime cost.
        if (g.DebugItemPickerActive && g.HoveredIdPreviousFrame == id)
            GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(255, 255, 0, 255));
        //if (g.DebugItemPickerBreakId == id)
        //    IM_DEBUG_BREAK();
    }

    if (g.NavDisableMouseHover)
        return false;

    return true;
}